

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_writer.cc
# Opt level: O1

void __thiscall SettingsWriter::SettingsWriter(SettingsWriter *this)

{
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  CBB_zero(&(this->cbb_).ctx_);
  return;
}

Assistant:

SettingsWriter::SettingsWriter() {}